

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O3

Scalar * __thiscall
Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]
          (Matrix_Sparse_Row<Disa::Matrix_Sparse> *this,size_t *i_column)

{
  size_t *i_row;
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  source_location *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type *local_a8;
  size_type local_a0;
  size_type local_98;
  undefined8 uStack_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  iterator_element local_48;
  undefined **local_28;
  
  i_row = &this->row_index;
  bVar1 = Matrix_Sparse::contains(this->matrix,i_row,i_column);
  if (bVar1) {
    Matrix_Sparse::find(&local_48,this->matrix,i_row,i_column);
    return local_48.value;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_28 = &PTR_s__workspace_llm4binary_github_lic_0018bc80;
  console_format_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48,
             (Disa *)0x0,(Log_Level)&local_28,in_RCX);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_48.column_index,(long)local_48.value);
  Matrix_Sparse::row_column_abi_cxx11_(&local_88,(Matrix_Sparse *)*i_row,*i_column,(size_t)in_RCX);
  std::operator+(&local_68,"Trying to access a zero element at [",&local_88);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_68,"].");
  local_a8 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8 == paVar4) {
    local_98 = paVar4->_M_allocated_capacity;
    uStack_90 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_a8 = &local_98;
  }
  else {
    local_98 = paVar4->_M_allocated_capacity;
  }
  local_a0 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_a8,local_a0);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  exit(1);
}

Assistant:

constexpr const Scalar& operator[](const std::size_t& i_column) const {
    ASSERT_DEBUG(matrix->contains(row_index, i_column),
                 "Trying to access a zero element at [" + matrix->row_column(row_index, i_column) + "].");
    return *matrix->find(row_index, i_column);
  }